

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O1

void __thiscall QPainterPathStroker::QPainterPathStroker(QPainterPathStroker *this,QPen *pen)

{
  PenCapStyle style;
  LineJoinMode LVar1;
  PenJoinStyle joinStyle;
  PenStyle PVar2;
  QPainterPathStrokerPrivate *pQVar3;
  long in_FS_OFFSET;
  qreal qVar4;
  double dVar5;
  double dVar6;
  QList<double> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (QPainterPathStrokerPrivate *)operator_new(0xd0);
  QStroker::QStroker((QStroker *)pQVar3);
  (pQVar3->dashPattern).d.size = 0;
  pQVar3->dashOffset = 0.0;
  (pQVar3->dashPattern).d.d = (Data *)0x0;
  (pQVar3->dashPattern).d.ptr = (double *)0x0;
  (pQVar3->stroker).super_QStrokerOps.m_moveTo = qt_path_stroke_move_to;
  (pQVar3->stroker).super_QStrokerOps.m_lineTo = qt_path_stroke_line_to;
  (pQVar3->stroker).super_QStrokerOps.m_cubicTo = qt_path_stroke_cubic_to;
  (this->d_ptr).d = pQVar3;
  qVar4 = QPen::widthF(pen);
  pQVar3 = (this->d_ptr).d;
  dVar6 = (double)(~-(ulong)(0.0 < qVar4) & 0x3ff0000000000000 |
                  (ulong)qVar4 & -(ulong)(0.0 < qVar4));
  (pQVar3->stroker).m_strokeWidth = dVar6;
  dVar6 = 1.0 / dVar6;
  dVar5 = 0.25;
  if (dVar6 <= 0.25) {
    dVar5 = dVar6;
  }
  if (dVar5 <= 0.00025) {
    dVar5 = 0.00025;
  }
  (pQVar3->stroker).super_QStrokerOps.m_curveThreshold = dVar5;
  style = QPen::capStyle(pen);
  pQVar3 = (this->d_ptr).d;
  LVar1 = QStroker::joinModeForCap(style);
  (pQVar3->stroker).m_capStyle = LVar1;
  joinStyle = QPen::joinStyle(pen);
  pQVar3 = (this->d_ptr).d;
  LVar1 = QStroker::joinModeForJoin(joinStyle);
  (pQVar3->stroker).m_joinStyle = LVar1;
  qVar4 = QPen::miterLimit(pen);
  (((this->d_ptr).d)->stroker).m_miterLimit = qVar4;
  qVar4 = QPen::dashOffset(pen);
  ((this->d_ptr).d)->dashOffset = qVar4;
  PVar2 = QPen::style(pen);
  if (PVar2 == CustomDashLine) {
    QPen::dashPattern(&local_38,pen);
    setDashPattern(this,&local_38);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,8,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else {
    PVar2 = QPen::style(pen);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      setDashPattern(this,PVar2);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

QPainterPathStroker::QPainterPathStroker(const QPen &pen)
    : d_ptr(new QPainterPathStrokerPrivate)
{
    setWidth(pen.widthF());
    setCapStyle(pen.capStyle());
    setJoinStyle(pen.joinStyle());
    setMiterLimit(pen.miterLimit());
    setDashOffset(pen.dashOffset());

    if (pen.style() == Qt::CustomDashLine)
        setDashPattern(pen.dashPattern());
    else
        setDashPattern(pen.style());
}